

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::bt_impl
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,size_t N,size_t Wn)

{
  data_container<leaf_t> *this_00;
  word_type value;
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  (this->sizes)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->sizes)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->sizes)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->sizes)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->sizes)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->sizes)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->sizes)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->sizes)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  this->size = 0;
  this->rank = 0;
  this->height = 0;
  this->free_node = 0;
  this->free_leaf = 0;
  (this->sizes)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->sizes)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->sizes)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  this->capacity = 0;
  this->node_width = 0;
  this->counter_width = 0;
  this->pointer_width = 0;
  this->degree = 0;
  this->buffer = 0;
  this->leaves_count = 0;
  this->nodes_count = 0;
  auVar13 = in_ZMM1._0_16_;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&this->sizes,0);
  (this->ranks)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->ranks)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (this->sizes)._size = 0;
  (this->sizes)._width = 0;
  (this->sizes)._field_mask = 0;
  (this->ranks)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->ranks)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->ranks)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->ranks)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&this->ranks,0);
  (this->pointers)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->pointers)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (this->ranks)._size = 0;
  (this->ranks)._width = 0;
  (this->ranks)._field_mask = 0;
  (this->pointers)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->pointers)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->pointers)._bits._container.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->pointers)._bits._container.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&this->pointers,0);
  this_00 = &this->leaves;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->pointers)._size = 0;
  (this->pointers)._width = 0;
  (this->pointers)._field_mask = 0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->leaves).
  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  std::
  _Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ::_M_initialize_map(&this_00->
                       super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                      ,0);
  this->capacity = N;
  if (N < 0x1001) {
    this->leaves_count = 1;
    sVar7 = this->free_leaf + 1;
    this->free_leaf = sVar7;
    std::
    deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
    ::resize(this_00,sVar7);
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(auVar13,N);
    this->node_width = Wn;
    auVar11._0_8_ = log2(auVar1._0_8_);
    auVar11._8_56_ = extraout_var;
    auVar1 = vroundsd_avx(auVar11._0_16_,auVar11._0_16_,9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar1._0_8_ + 1.0;
    lVar5 = vcvttsd2usi_avx512f(auVar10);
    this->counter_width = lVar5 + 1U;
    uVar2 = Wn / (lVar5 + 1U);
    auVar13 = vcvtusi2sd_avx512f(auVar13,uVar2);
    this->degree = uVar2;
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    auVar13 = vroundsd_avx(auVar13,auVar13,10);
    lVar5 = vcvttsd2usi_avx512f(auVar13);
    uVar3 = lVar5 + (ulong)(lVar5 == 0);
    do {
      uVar8 = uVar3;
      auVar13 = vcvtusi2sd_avx512f(in_XMM2,(uVar2 + 1) / uVar8);
      auVar1 = vcvtusi2sd_avx512f(in_XMM2,uVar8);
      uVar3 = uVar8 - 1;
    } while (auVar13._0_8_ < auVar1._0_8_);
    uVar9 = 0;
    uVar2 = uVar8 + 1;
    this->buffer = uVar8;
    auVar13 = vcvtusi2sd_avx512f(in_XMM2,N / (((0xfff - (uVar8 - 1)) * uVar8) / uVar2));
    lVar5 = vcvttsd2usi_avx512f(auVar13);
    uVar6 = lVar5 + 1;
    this->leaves_count = uVar6;
    this->nodes_count = 0;
    uVar3 = uVar6;
    do {
      uVar3 = (uVar3 / uVar8 + 1) - (ulong)(uVar3 % uVar8 == 0);
      uVar9 = uVar9 + uVar3;
    } while (1 < uVar3);
    uVar3 = uVar2;
    if (uVar2 < uVar6) {
      uVar3 = uVar6;
    }
    if (uVar2 < uVar9) {
      uVar2 = uVar9;
    }
    this->leaves_count = uVar3;
    this->nodes_count = uVar2;
    if (uVar2 < uVar6) {
      uVar2 = uVar3;
    }
    auVar13 = vcvtusi2sd_avx512f(in_XMM2,uVar2);
    auVar12._0_8_ = log2(auVar13._0_8_);
    auVar12._8_56_ = extraout_var_00;
    auVar13 = vroundsd_avx(auVar12._0_16_,auVar12._0_16_,10);
    sVar4 = vcvttsd2usi_avx512f(auVar13);
    this->pointer_width = sVar4;
    this->height = 1;
    sVar4 = this->free_node + 1;
    this->free_node = sVar4;
    reserve_nodes(this,sVar4);
    sVar7 = this->free_leaf + 1;
    this->free_leaf = sVar7;
    std::
    deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
    ::resize(this_00,sVar7);
    value = this->free_leaf;
    sVar7 = value + 1;
    this->free_leaf = sVar7;
    std::
    deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
    ::resize(this_00,sVar7);
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (&(this->pointers)._bits,0,(this->pointers)._width,value);
  }
  return;
}

Assistant:

bt_impl<W, AP>::bt_impl(size_t N, size_t Wn)
        {
            capacity = N;
            
            // When all the maximum capacity fits in a leaf, we act consequently
            if(small()) {
                // We only need one leaf
                leaves_count = 1;
                alloc_leaf();
                return;
            }
            
            node_width = Wn;
            
            // The + 1 at the end is for the extra flag bit
            counter_width = size_t(floor(log2(capacity)) + 1) + 1;
            
            degree = node_width / counter_width;
            
            for(buffer = max(size_t(ceil(sqrt(degree))), size_t(1));
                floor((degree + 1)/buffer) < buffer;
                --buffer);
            
            // Maximum number of leaves needed in the worst case
            leaves_count = size_t(ceil(capacity / ((buffer *
                                                    (leaf_bits - buffer))
                                                  / (buffer + 1))))
                           + 1; // for the sentinel leaf at index 0
            
            size_t minimum_degree = buffer;
            
            // Total number of internal nodes
            nodes_count = 0;
            size_t level_count = leaves_count;
            do
            {
                level_count = ceildiv(level_count, minimum_degree);
                nodes_count += level_count;
            } while(level_count > 1);
            
            // For values of small capacity relatively to the leaves and nodes
            // bit size, the buffer could be greater than the maximum count.
            leaves_count = max(leaves_count, buffer + 1);
            nodes_count = max(nodes_count, buffer + 1);
            
            // Width of pointers
            pointer_width = size_t(ceil(log2(max(nodes_count, leaves_count))));
            
            assert(pointer_width <= counter_width);
            assert(pointer_width * (degree + 1) <= node_width);
            
            // Allocate all the needed memory ahead of time if the policy says so
            if(AP == alloc_immediatly) {
                reserve_nodes(nodes_count);
                leaves.resize(leaves_count);
            }
            
            // Allocate space for the root node and its first leaf
            height = 1; // Initial height is 1
            alloc_node(); // Initial root node
            alloc_leaf(); // Sentinel leaf for position zero
            root().pointers(0) = alloc_leaf(); // First leaf
        }